

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O3

int pt_enc_get_offset(pt_encoder *encoder,uint64_t *offset)

{
  uint8_t *puVar1;
  int iVar2;
  
  iVar2 = -2;
  if (offset != (uint64_t *)0x0 && encoder != (pt_encoder *)0x0) {
    iVar2 = -1;
    if ((encoder->pos != (uint8_t *)0x0) &&
       (puVar1 = (encoder->config).begin, puVar1 != (uint8_t *)0x0)) {
      *offset = (long)encoder->pos - (long)puVar1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int pt_enc_get_offset(const struct pt_encoder *encoder, uint64_t *offset)
{
	const uint8_t *raw, *begin;

	if (!encoder || !offset)
		return -pte_invalid;

	/* The encoder is synchronized at all times. */
	raw = encoder->pos;
	if (!raw)
		return -pte_internal;

	begin = encoder->config.begin;
	if (!begin)
		return -pte_internal;

	*offset = (uint64_t) (int64_t) (raw - begin);
	return 0;
}